

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataType.cpp
# Opt level: O2

string * __thiscall
CoreML::FeatureType::toString_abi_cxx11_(string *__return_storage_ptr__,FeatureType *this)

{
  uint uVar1;
  ImageFeatureType *params;
  DictionaryFeatureType *pDVar2;
  SequenceFeatureType *pSVar3;
  ostream *poVar4;
  SizeRange *pSVar5;
  ArrayFeatureType *params_00;
  char useArrayFormat;
  TypeCase tag;
  ImageFeatureType_ColorSpace colorspace;
  KeyTypeCase tag_00;
  TypeCase tag_01;
  TypeCase seqType;
  ArrayFeatureType_ArrayDataType dataType;
  char *__rhs;
  undefined1 in_R8B;
  string sStack_1e8;
  vector<long,_std::allocator<long>_> size;
  stringstream ss;
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  uVar1 = ((this->m_type).
           super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          )->_oneof_case_[0];
  featureTypeToString_abi_cxx11_(&sStack_1e8,(CoreML *)(ulong)uVar1,tag);
  std::operator<<(local_1a0,(string *)&sStack_1e8);
  std::__cxx11::string::~string((string *)&sStack_1e8);
  if (3 < uVar1 - 4) goto switchD_00213de6_default;
  useArrayFormat = (char)(&switchD_00213de6::switchdataD_002b5dc8)[uVar1 - 4] + -0x38;
  switch(uVar1) {
  case 4:
    params = Specification::FeatureType::imagetype
                       ((this->m_type).
                        super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr);
    std::operator<<(local_1a0," (");
    colorSpaceToString_abi_cxx11_(&sStack_1e8,(CoreML *)(ulong)(uint)params->colorspace_,colorspace)
    ;
    std::operator<<(local_1a0,(string *)&sStack_1e8);
    std::__cxx11::string::~string((string *)&sStack_1e8);
    defaultSizeOf(&size,params);
    if (size.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        size.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      std::operator<<(local_1a0," ");
      dimensionsToString_abi_cxx11_
                (&sStack_1e8,(CoreML *)&size,(vector<long,_std::allocator<long>_> *)0x0,
                 (bool)useArrayFormat);
      std::operator<<(local_1a0,(string *)&sStack_1e8);
      std::__cxx11::string::~string((string *)&sStack_1e8);
    }
    std::operator<<(local_1a0,")");
    break;
  case 5:
    params_00 = Specification::FeatureType::multiarraytype
                          ((this->m_type).
                           super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr);
    poVar4 = std::operator<<(local_1a0," (");
    dataTypeToString_abi_cxx11_(&sStack_1e8,(CoreML *)(ulong)(uint)params_00->datatype_,dataType);
    std::operator<<(poVar4,(string *)&sStack_1e8);
    std::__cxx11::string::~string((string *)&sStack_1e8);
    defaultShapeOf(&size,params_00);
    if (size.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        size.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      std::operator<<(local_1a0," ");
      dimensionsToString_abi_cxx11_
                (&sStack_1e8,(CoreML *)&size,(vector<long,_std::allocator<long>_> *)0x0,
                 (bool)useArrayFormat);
      std::operator<<(local_1a0,(string *)&sStack_1e8);
      std::__cxx11::string::~string((string *)&sStack_1e8);
    }
    std::operator<<(local_1a0,")");
    break;
  case 6:
    pDVar2 = Specification::FeatureType::dictionarytype
                       ((this->m_type).
                        super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr);
    std::operator<<(local_1a0," (");
    keyTypeToString_abi_cxx11_(&sStack_1e8,(CoreML *)(ulong)pDVar2->_oneof_case_[0],tag_00);
    std::operator<<(local_1a0,(string *)&sStack_1e8);
    std::__cxx11::string::~string((string *)&sStack_1e8);
    std::operator<<(local_1a0,anon_var_dwarf_385cde);
    featureTypeToString_abi_cxx11_(&sStack_1e8,(CoreML *)0x2,tag_01);
    std::operator<<(local_1a0,(string *)&sStack_1e8);
    std::__cxx11::string::~string((string *)&sStack_1e8);
    std::operator<<(local_1a0,")");
    goto switchD_00213de6_default;
  case 7:
    pSVar3 = Specification::FeatureType::sequencetype
                       ((this->m_type).
                        super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr);
    std::operator<<(local_1a0," (");
    sequenceTypeToString_abi_cxx11_(&sStack_1e8,(CoreML *)(ulong)pSVar3->_oneof_case_[0],seqType);
    std::operator<<(local_1a0,(string *)&sStack_1e8);
    std::__cxx11::string::~string((string *)&sStack_1e8);
    poVar4 = std::operator<<(local_1a0," ");
    pSVar5 = pSVar3->sizerange_;
    if (pSVar5 == (SizeRange *)0x0) {
      pSVar5 = (SizeRange *)&Specification::_SizeRange_default_instance_;
    }
    rangeToString_abi_cxx11_
              (&sStack_1e8,(CoreML *)pSVar5->lowerbound_,pSVar5->upperbound_,0,(bool)in_R8B);
    std::operator<<(poVar4,(string *)&sStack_1e8);
    std::__cxx11::string::~string((string *)&sStack_1e8);
    std::operator<<(local_1a0,")");
    goto switchD_00213de6_default;
  }
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            (&size.super__Vector_base<long,_std::allocator<long>_>);
switchD_00213de6_default:
  std::__cxx11::stringbuf::str();
  __rhs = "";
  if (((this->m_type).
       super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      isoptional_ != false) {
    __rhs = "?";
  }
  std::operator+(__return_storage_ptr__,&sStack_1e8,__rhs);
  std::__cxx11::string::~string((string *)&sStack_1e8);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string FeatureType::toString() const {
        std::stringstream ss;
        Specification::FeatureType::TypeCase tag = m_type->Type_case();

        ss << featureTypeToString(tag);

        switch (tag) {
            case Specification::FeatureType::kMultiArrayType:
            {
                const Specification::ArrayFeatureType& params = m_type->multiarraytype();
                ss << " (" << dataTypeToString(params.datatype());
                std::vector<int64_t> shape = defaultShapeOf(params);
                if (shape.size() > 0) {
                    ss << " ";
                    ss << dimensionsToString(shape);
                }
                ss << ")";
                break;
            }
            case Specification::FeatureType::kDictionaryType:
            {
                const Specification::DictionaryFeatureType& params = m_type->dictionarytype();
                ss << " (";
                ss << keyTypeToString(params.KeyType_case());
                ss << " → ";
                ss << featureTypeToString(Specification::FeatureType::kDoubleType); // assume double value
                ss << ")";
                break;
            }
            case Specification::FeatureType::kImageType:
            {
                const Specification::ImageFeatureType& params = m_type->imagetype();
                ss << " (";
                ss << colorSpaceToString(params.colorspace());
                std::vector<int64_t> size = defaultSizeOf(params);
                if (size.size() > 0) {
                    ss << " ";
                    ss << dimensionsToString(size);
                }
                ss << ")";
                break;
            }
            case Specification::FeatureType::kSequenceType:
            {
                const Specification::SequenceFeatureType& params = m_type->sequencetype();
                ss << " (";
                ss << sequenceTypeToString(params.Type_case());
                ss << " " << rangeToString((int64_t)params.sizerange().lowerbound(),params.sizerange().upperbound());
                ss << ")";
                break;
            }
            default:
                break;
        }
        return ss.str() + (m_type->isoptional() ? "?" : "");
    }